

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

void qtree_expand(uchar *infile,uchar *a,int nx,int ny,uchar *b)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  ulong uVar4;
  int iVar5;
  uchar *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  
  uVar15 = (long)(nx + 1) / 2;
  uVar7 = uVar15 & 0xffffffff;
  uVar4 = (long)(ny + 1) / 2;
  iVar10 = (int)uVar4;
  iVar13 = (int)uVar15;
  iVar5 = iVar10 * iVar13 + -1;
  iVar10 = iVar10 * 2 + (iVar13 + -1) * ny * 2 + -2;
  while (0 < (int)uVar7) {
    uVar7 = (ulong)((int)uVar7 - 1);
    puVar6 = a + iVar5;
    iVar13 = iVar10;
    for (uVar15 = uVar4 & 0xffffffff; 0 < (int)uVar15; uVar15 = (ulong)((int)uVar15 - 1)) {
      b[iVar13] = *puVar6;
      iVar5 = iVar5 + -1;
      puVar6 = puVar6 + -1;
      iVar13 = iVar13 + -2;
    }
    iVar10 = iVar10 + ny * -2;
  }
  iVar5 = 0;
  iVar13 = 0;
  iVar10 = ny;
  while( true ) {
    lVar8 = (long)iVar5;
    if (nx + -1 <= iVar13) break;
    lVar11 = (long)iVar10;
    lVar12 = lVar11 << 0x20;
    lVar9 = lVar8 << 0x20;
    for (lVar14 = 0; (int)lVar14 < ny + -1; lVar14 = lVar14 + 2) {
      uVar15 = (ulong)b[lVar14 + lVar8];
      if (uVar15 < 0x10) {
        uVar1 = (&DAT_001ce5b2)[uVar15];
        uVar2 = (&DAT_001ce5c2)[uVar15];
        uVar3 = (&DAT_001ce5d2)[uVar15];
        b[lVar14 + lVar11 + 1] = (&DAT_001ce5a2)[uVar15];
        b[lVar14 + lVar11] = uVar1;
        b[lVar14 + lVar8 + 1] = uVar2;
        b[lVar14 + lVar8] = uVar3;
      }
      lVar12 = lVar12 + 0x200000000;
      lVar9 = lVar9 + 0x200000000;
    }
    if ((int)lVar14 < ny) {
      lVar9 = lVar9 >> 0x20;
      b[lVar12 >> 0x20] = b[lVar9] >> 1 & 1;
      b[lVar9] = b[lVar9] >> 3 & 1;
    }
    iVar13 = iVar13 + 2;
    iVar5 = iVar5 + ny * 2;
    iVar10 = iVar10 + ny * 2;
  }
  if (iVar13 < nx) {
    lVar11 = lVar8 << 0x20;
    for (lVar9 = 0; (int)lVar9 < ny + -1; lVar9 = lVar9 + 2) {
      b[lVar9 + lVar8 + 1] = b[lVar9 + lVar8] >> 2 & 1;
      b[lVar9 + lVar8] = b[lVar9 + lVar8] >> 3 & 1;
      lVar11 = lVar11 + 0x200000000;
    }
    if ((int)lVar9 < ny) {
      b[lVar11 >> 0x20] = b[lVar11 >> 0x20] >> 3 & 1;
    }
  }
  for (uVar15 = (ulong)(uint)(ny * nx); 0 < (int)uVar15; uVar15 = uVar15 - 1) {
    if (b[uVar15 - 1] != '\0') {
      iVar10 = input_huffman(infile);
      b[uVar15 - 1] = (uchar)iVar10;
    }
  }
  return;
}

Assistant:

static void
qtree_expand(unsigned char *infile, unsigned char a[], int nx, int ny, unsigned char b[])
{
int i;

	/*
	 * first copy a to b, expanding each 4-bit value
	 */
	qtree_copy(a,nx,ny,b,ny);
	/*
	 * now read new 4-bit values into b for each non-zero element
	 */
	for (i = nx*ny-1; i >= 0; i--) {
		if (b[i]) b[i] = input_huffman(infile);
	}
}